

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image_utils.cpp
# Opt level: O0

uint8 * crnlib::image_utils::read_image_from_memory
                  (uint8 *pImage,int nSize,int *pWidth,int *pHeight,int *pActualComps,int req_comps,
                  char *pFilename)

{
  bool bVar1;
  uint uVar2;
  color_quad<unsigned_char,_int> *__src;
  uint local_198;
  undefined1 local_194 [4];
  uint32 n;
  pixel_packer packer;
  image_u8 luma_img;
  uint8 *pSrc;
  uint8 *pDst;
  image_u8 *pImg;
  image_u8 img;
  undefined1 local_d8 [8];
  data_stream_serializer serializer;
  undefined1 local_b8 [8];
  buffer_stream buf_stream;
  mipmapped_texture tex;
  int req_comps_local;
  int *pActualComps_local;
  int *pHeight_local;
  int *pWidth_local;
  int nSize_local;
  uint8 *pImage_local;
  
  *pWidth = 0;
  *pHeight = 0;
  *pActualComps = 0;
  if ((req_comps < 1) || (4 < req_comps)) {
    pImage_local = (uint8 *)0x0;
  }
  else {
    mipmapped_texture::mipmapped_texture((mipmapped_texture *)&buf_stream.m_size);
    buffer_stream::buffer_stream((buffer_stream *)local_b8,pImage,nSize);
    data_stream::set_name((data_stream *)local_b8,pFilename);
    data_stream_serializer::data_stream_serializer
              ((data_stream_serializer *)local_d8,(data_stream *)local_b8);
    bVar1 = mipmapped_texture::read_from_stream
                      ((mipmapped_texture *)&buf_stream.m_size,(data_stream_serializer *)local_d8,
                       cFormatInvalid);
    if (bVar1) {
      bVar1 = mipmapped_texture::is_packed((mipmapped_texture *)&buf_stream.m_size);
      if ((!bVar1) ||
         (bVar1 = mipmapped_texture::unpack_from_dxt((mipmapped_texture *)&buf_stream.m_size,true),
         bVar1)) {
        image<crnlib::color_quad<unsigned_char,_int>_>::image
                  ((image<crnlib::color_quad<unsigned_char,_int>_> *)&pImg);
        pDst = (uint8 *)mipmapped_texture::get_level_image
                                  ((mipmapped_texture *)&buf_stream.m_size,0,0,(image_u8 *)&pImg,3);
        if ((image_u8 *)pDst == (image_u8 *)0x0) {
          pImage_local = (uint8 *)0x0;
        }
        else {
          uVar2 = mipmapped_texture::get_width((mipmapped_texture *)&buf_stream.m_size);
          *pWidth = uVar2;
          uVar2 = mipmapped_texture::get_height((mipmapped_texture *)&buf_stream.m_size);
          *pHeight = uVar2;
          bVar1 = image<crnlib::color_quad<unsigned_char,_int>_>::has_alpha
                            ((image<crnlib::color_quad<unsigned_char,_int>_> *)pDst);
          if (bVar1) {
            *pActualComps = 4;
          }
          else {
            bVar1 = image<crnlib::color_quad<unsigned_char,_int>_>::is_grayscale
                              ((image<crnlib::color_quad<unsigned_char,_int>_> *)pDst);
            if (bVar1) {
              *pActualComps = 1;
            }
            else {
              *pActualComps = 3;
            }
          }
          if (req_comps == 4) {
            uVar2 = mipmapped_texture::get_total_pixels((mipmapped_texture *)&buf_stream.m_size);
            pSrc = (uint8 *)malloc((ulong)uVar2 << 2);
            __src = image<crnlib::color_quad<unsigned_char,_int>_>::get_ptr
                              ((image<crnlib::color_quad<unsigned_char,_int>_> *)pDst);
            uVar2 = mipmapped_texture::get_total_pixels((mipmapped_texture *)&buf_stream.m_size);
            memcpy(pSrc,__src,(ulong)uVar2 << 2);
          }
          else {
            image<crnlib::color_quad<unsigned_char,_int>_>::image
                      ((image<crnlib::color_quad<unsigned_char,_int>_> *)(packer.m_comp_max + 3));
            if (req_comps == 1) {
              image<crnlib::color_quad<unsigned_char,_int>_>::operator=
                        ((image<crnlib::color_quad<unsigned_char,_int>_> *)(packer.m_comp_max + 3),
                         (image<crnlib::color_quad<unsigned_char,_int>_> *)pDst);
              image<crnlib::color_quad<unsigned_char,_int>_>::convert_to_grayscale
                        ((image<crnlib::color_quad<unsigned_char,_int>_> *)(packer.m_comp_max + 3));
              pDst = (uint8 *)(packer.m_comp_max + 3);
            }
            pixel_packer::pixel_packer((pixel_packer *)local_194,req_comps,8,-1,false);
            pSrc = pack_image<crnlib::image<crnlib::color_quad<unsigned_char,int>>>
                             ((image<crnlib::color_quad<unsigned_char,_int>_> *)pDst,
                              (pixel_packer *)local_194,&local_198);
            image<crnlib::color_quad<unsigned_char,_int>_>::~image
                      ((image<crnlib::color_quad<unsigned_char,_int>_> *)(packer.m_comp_max + 3));
          }
          pImage_local = pSrc;
        }
        img.m_pixel_buf.m_capacity = 1;
        image<crnlib::color_quad<unsigned_char,_int>_>::~image
                  ((image<crnlib::color_quad<unsigned_char,_int>_> *)&pImg);
      }
      else {
        pImage_local = (uint8 *)0x0;
        img.m_pixel_buf.m_capacity = 1;
      }
    }
    else {
      pImage_local = (uint8 *)0x0;
      img.m_pixel_buf.m_capacity = 1;
    }
    buffer_stream::~buffer_stream((buffer_stream *)local_b8);
    mipmapped_texture::~mipmapped_texture((mipmapped_texture *)&buf_stream.m_size);
  }
  return pImage_local;
}

Assistant:

uint8* read_image_from_memory(const uint8* pImage, int nSize, int* pWidth, int* pHeight, int* pActualComps, int req_comps, const char* pFilename)
        {
            *pWidth = 0;
            *pHeight = 0;
            *pActualComps = 0;

            if ((req_comps < 1) || (req_comps > 4))
            {
                return nullptr;
            }

            mipmapped_texture tex;

            buffer_stream buf_stream(pImage, nSize);
            buf_stream.set_name(pFilename);
            data_stream_serializer serializer(buf_stream);

            if (!tex.read_from_stream(serializer))
            {
                return nullptr;
            }

            if (tex.is_packed())
            {
                if (!tex.unpack_from_dxt(true))
                {
                    return nullptr;
                }
            }

            image_u8 img;
            image_u8* pImg = tex.get_level_image(0, 0, img);
            if (!pImg)
            {
                return nullptr;
            }

            *pWidth = tex.get_width();
            *pHeight = tex.get_height();

            if (pImg->has_alpha())
            {
                *pActualComps = 4;
            }
            else if (pImg->is_grayscale())
            {
                *pActualComps = 1;
            }
            else
            {
                *pActualComps = 3;
            }

            uint8* pDst = nullptr;
            if (req_comps == 4)
            {
                pDst = (uint8*)malloc(tex.get_total_pixels() * sizeof(uint32));
                uint8* pSrc = (uint8*)pImg->get_ptr();
                memcpy(pDst, pSrc, tex.get_total_pixels() * sizeof(uint32));
            }
            else
            {
                image_u8 luma_img;
                if (req_comps == 1)
                {
                    luma_img = *pImg;
                    luma_img.convert_to_grayscale();
                    pImg = &luma_img;
                }

                pixel_packer packer(req_comps, 8);
                uint32 n;
                pDst = image_utils::pack_image(*pImg, packer, n);
            }

            return pDst;
        }